

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  TestNode *pTVar1;
  ulong uVar2;
  DataType local_78;
  DataType local_74;
  ShaderType local_48;
  int shaderType;
  DataType uintType;
  DataType intType;
  int vecSize;
  TestCaseGroup *uintGroup;
  TestCaseGroup *intGroup;
  deUint32 shaderBits;
  ShaderCommonFunctionTests *this_local;
  
  addFunctionCases<deqp::gles31::Functional::AbsCase>
            (&this->super_TestCaseGroup,"abs",true,true,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::SignCase>
            (&this->super_TestCaseGroup,"sign",true,true,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::FloorCase>
            (&this->super_TestCaseGroup,"floor",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::TruncCase>
            (&this->super_TestCaseGroup,"trunc",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::RoundCase>
            (&this->super_TestCaseGroup,"round",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::RoundEvenCase>
            (&this->super_TestCaseGroup,"roundeven",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::CeilCase>
            (&this->super_TestCaseGroup,"ceil",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::FractCase>
            (&this->super_TestCaseGroup,"fract",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::ModfCase>
            (&this->super_TestCaseGroup,"modf",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::IsnanCase>
            (&this->super_TestCaseGroup,"isnan",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::IsinfCase>
            (&this->super_TestCaseGroup,"isinf",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::FloatBitsToIntCase>
            (&this->super_TestCaseGroup,"floatbitstoint",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::FloatBitsToUintCase>
            (&this->super_TestCaseGroup,"floatbitstouint",true,false,false,0x3c);
  addFunctionCases<deqp::gles31::Functional::FrexpCase>
            (&this->super_TestCaseGroup,"frexp",true,false,false,0x3f);
  addFunctionCases<deqp::gles31::Functional::LdexpCase>
            (&this->super_TestCaseGroup,"ldexp",true,false,false,0x3f);
  addFunctionCases<deqp::gles31::Functional::FmaCase>
            (&this->super_TestCaseGroup,"fma",true,false,false,0x3f);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "intbitstofloat","intBitsToFloat() Tests");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "uintbitstofloat","uintBitsToFloat() Tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  uintType = TYPE_FLOAT;
  uVar2 = extraout_RAX;
  while ((int)uintType < 4) {
    if ((int)uintType < 2) {
      local_74 = TYPE_INT;
      local_78 = TYPE_UINT;
    }
    else {
      local_74 = glu::getDataTypeIntVec(uintType);
      local_78 = glu::getDataTypeUintVec(uintType);
    }
    for (local_48 = SHADERTYPE_VERTEX; (int)local_48 < 6; local_48 = local_48 + SHADERTYPE_FRAGMENT)
    {
      if ((1 << ((byte)local_48 & 0x1f) & 0x3cU) != 0) {
        pTVar1 = (TestNode *)operator_new(0x280);
        BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar1,(this->super_TestCaseGroup).m_context,local_74,local_48
                  );
        tcu::TestNode::addChild(node,pTVar1);
        pTVar1 = (TestNode *)operator_new(0x280);
        BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar1,(this->super_TestCaseGroup).m_context,local_78,local_48
                  );
        tcu::TestNode::addChild(node_00,pTVar1);
      }
    }
    uintType = uintType + TYPE_FLOAT;
    uVar2 = (ulong)uintType;
  }
  return (int)uVar2;
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS,
		NEW_SHADERS = TC|TE|GS|CS,
	};

	//																	Float?	Int?	Uint?	Shaders
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false,	NEW_SHADERS);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false,	NEW_SHADERS);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false,	NEW_SHADERS);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false,	NEW_SHADERS);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false,	NEW_SHADERS);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false,	NEW_SHADERS);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false,	NEW_SHADERS);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false,	NEW_SHADERS);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false,	NEW_SHADERS);

	addFunctionCases<FrexpCase>				(this,	"frexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<LdexpCase>				(this,	"ldexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FmaCase>				(this,	"fma",				true,	false,	false,	ALL_SHADERS);

	// (u)intBitsToFloat()
	{
		const deUint32		shaderBits	= NEW_SHADERS;
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
			{
				if (shaderBits & (1<<shaderType))
				{
					intGroup->addChild(new BitsToFloatCase(m_context, intType, glu::ShaderType(shaderType)));
					uintGroup->addChild(new BitsToFloatCase(m_context, uintType, glu::ShaderType(shaderType)));
				}
			}
		}
	}
}